

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::rayTest
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *rayFrom,cbtVector3 *rayTo,
          cbtBroadphaseRayCallback *rayCallback,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  unsigned_short i;
  ushort uVar1;
  
  if (this->m_raycastAccelerator != (cbtDbvtBroadphase *)0x0) {
    (*(this->m_raycastAccelerator->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[6])();
    return;
  }
  for (uVar1 = 1; (uint)uVar1 <= (uint)this->m_numHandles * 2; uVar1 = uVar1 + 1) {
    if ((this->m_pEdges[0][uVar1].m_pos & 1) != 0) {
      (*(rayCallback->super_cbtBroadphaseAabbCallback)._vptr_cbtBroadphaseAabbCallback[2])
                (rayCallback,this->m_pHandles + this->m_pEdges[0][uVar1].m_handle);
    }
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const cbtVector3& rayFrom, const cbtVector3& rayTo, cbtBroadphaseRayCallback& rayCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom, rayTo, rayCallback, aabbMin, aabbMax);
	}
	else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i = 1; i < m_numHandles * 2 + 1; i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}